

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O2

int If_CutGetCone_rec(If_Man_t *p,If_Obj_t *pObj,If_Cut_t *pCut)

{
  float *pfVar1;
  int iVar2;
  ulong uVar3;
  
  uVar3 = 0;
  do {
    if ((byte)pCut->field_0x1f == uVar3) break;
    pfVar1 = &pCut[1].Area + uVar3;
    if (*pfVar1 == (float)pObj->Id) {
      return 1;
    }
    uVar3 = uVar3 + 1;
  } while ((int)*pfVar1 <= pObj->Id);
  if (((undefined1  [112])*pObj & (undefined1  [112])0xf) != (undefined1  [112])0x2) {
    for (; pObj != (If_Obj_t *)0x0; pObj = pObj->pEquiv) {
      iVar2 = If_CutGetCone_rec(p,pObj->pFanin0,pCut);
      if ((iVar2 != 0) && (iVar2 = If_CutGetCone_rec(p,pObj->pFanin1,pCut), iVar2 != 0)) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int If_CutGetCone_rec( If_Man_t * p, If_Obj_t * pObj, If_Cut_t * pCut )
{
    If_Obj_t * pTemp;
    int i, RetValue;
    // check if the node is in the cut
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        if ( pCut->pLeaves[i] == pObj->Id )
            return 1;
        else if ( pCut->pLeaves[i] > pObj->Id )
            break;
    // return if we reached the boundary
    if ( If_ObjIsCi(pObj) )
        return 0;
    // check the choice node
    for ( pTemp = pObj; pTemp; pTemp = pTemp->pEquiv )
    {
        // check if the node itself is bound
        RetValue = If_CutGetCone_rec( p, If_ObjFanin0(pTemp), pCut );
        if ( RetValue )
            RetValue &= If_CutGetCone_rec( p, If_ObjFanin1(pTemp), pCut );
        if ( RetValue )
            return 1;
    }
    return 0;
}